

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_expand_data.cc
# Opt level: O0

TemplateAnnotator * __thiscall ctemplate::PerExpandData::annotator(PerExpandData *this)

{
  int iVar1;
  PerExpandData *this_local;
  
  if (this->annotator_ == (TemplateAnnotator *)0x0) {
    if (annotator()::g_default_annotator == '\0') {
      iVar1 = __cxa_guard_acquire(&annotator()::g_default_annotator);
      if (iVar1 != 0) {
        TextTemplateAnnotator::TextTemplateAnnotator(&annotator::g_default_annotator);
        __cxa_atexit(TextTemplateAnnotator::~TextTemplateAnnotator,&annotator::g_default_annotator,
                     &__dso_handle);
        __cxa_guard_release(&annotator()::g_default_annotator);
      }
    }
    this_local = (PerExpandData *)&annotator::g_default_annotator;
  }
  else {
    this_local = (PerExpandData *)this->annotator_;
  }
  return (TemplateAnnotator *)this_local;
}

Assistant:

TemplateAnnotator* PerExpandData::annotator() const {
  if (annotator_ != NULL) {
    return annotator_;
  }
  // TextTemplateAnnotator has no static state.  So direct static definition
  // should be safe.
  static TextTemplateAnnotator g_default_annotator;
  return &g_default_annotator;
}